

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O1

void Intp_ManResize(Intp_Man_t *p)

{
  int iVar1;
  lit *plVar2;
  char *pcVar3;
  Sto_Cls_t **ppSVar4;
  int *piVar5;
  int iVar6;
  size_t sVar7;
  
  iVar1 = p->pCnf->nVars;
  if (p->nVarsAlloc < iVar1) {
    if (p->nVarsAlloc == 0) {
      p->nVarsAlloc = 1;
    }
    iVar6 = p->nVarsAlloc;
    if (iVar6 < iVar1) {
      do {
        iVar6 = iVar6 * 2;
      } while (iVar6 < iVar1);
      p->nVarsAlloc = iVar6;
    }
    if (p->pTrail == (lit *)0x0) {
      plVar2 = (lit *)malloc((long)iVar6 << 2);
    }
    else {
      plVar2 = (lit *)realloc(p->pTrail,(long)iVar6 << 2);
    }
    p->pTrail = plVar2;
    sVar7 = (long)p->nVarsAlloc << 2;
    if (p->pAssigns == (lit *)0x0) {
      plVar2 = (lit *)malloc(sVar7);
    }
    else {
      plVar2 = (lit *)realloc(p->pAssigns,sVar7);
    }
    p->pAssigns = plVar2;
    if (p->pSeens == (char *)0x0) {
      pcVar3 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      pcVar3 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = pcVar3;
    sVar7 = (long)p->nVarsAlloc << 3;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      ppSVar4 = (Sto_Cls_t **)malloc(sVar7);
    }
    else {
      ppSVar4 = (Sto_Cls_t **)realloc(p->pReasons,sVar7);
    }
    p->pReasons = ppSVar4;
    sVar7 = (long)p->nVarsAlloc << 4;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      ppSVar4 = (Sto_Cls_t **)malloc(sVar7);
    }
    else {
      ppSVar4 = (Sto_Cls_t **)realloc(p->pWatches,sVar7);
    }
    p->pWatches = ppSVar4;
  }
  memset(p->pAssigns,0xff,(long)p->pCnf->nVars << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  iVar1 = p->pCnf->nClauses;
  if (p->nClosAlloc < iVar1) {
    if (p->nClosAlloc == 0) {
      p->nClosAlloc = 1;
    }
    iVar6 = p->nClosAlloc;
    if (iVar6 < iVar1) {
      do {
        iVar6 = iVar6 * 2;
      } while (iVar6 < iVar1);
      p->nClosAlloc = iVar6;
    }
    if (p->pProofNums == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar6 << 2);
    }
    else {
      piVar5 = (int *)realloc(p->pProofNums,(long)iVar6 << 2);
    }
    p->pProofNums = piVar5;
  }
  memset(p->pProofNums,0,(long)p->pCnf->nClauses << 2);
  return;
}

Assistant:

void Intp_ManResize( Intp_Man_t * p )
{
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
//        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
//    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC( int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );
}